

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map.cc
# Opt level: O1

const_iterator __thiscall bloaty::RangeMap::FindContainingOrAfter(RangeMap *this,uint64_t addr)

{
  _Rb_tree_node_base *p_Var1;
  const_iterator iter;
  uint64_t uVar2;
  const_iterator cVar3;
  
  cVar3._M_node = &(this->mappings_)._M_t._M_impl.super__Rb_tree_header._M_header;
  for (p_Var1 = (this->mappings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var1 != (_Rb_tree_node_base *)0x0;
      p_Var1 = (&p_Var1->_M_left)[*(ulong *)(p_Var1 + 1) <= addr]) {
    if (addr < *(ulong *)(p_Var1 + 1)) {
      cVar3._M_node = p_Var1;
    }
  }
  if (cVar3._M_node != (this->mappings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
    iter._M_node = (_Base_ptr)std::_Rb_tree_decrement(cVar3._M_node);
    if (*(ulong *)(iter._M_node + 1) <= addr) {
      uVar2 = RangeEndUnknownLimit(this,iter,0xffffffffffffffff);
      if (addr < uVar2) {
        cVar3._M_node = iter._M_node;
      }
    }
  }
  return (const_iterator)cVar3._M_node;
}

Assistant:

RangeMap::Map::const_iterator RangeMap::FindContainingOrAfter(
    uint64_t addr) const {
  auto after = mappings_.upper_bound(addr);
  auto it = after;
  if (it != mappings_.begin() && (--it, EntryContains(it, addr))) {
    return it;  // Containing
  } else {
    return after;  // May be end().
  }
}